

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroupPrivate::connectUncontrolledAnimations(QParallelAnimationGroupPrivate *this)

{
  QAbstractAnimation **ppQVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long in_FS_OFFSET;
  QAbstractAnimation *animation;
  QAbstractAnimation *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar1 = (this->super_QAnimationGroupPrivate).animations.d.ptr;
  lVar2 = (this->super_QAnimationGroupPrivate).animations.d.size;
  lVar5 = 0;
  do {
    if (lVar2 << 3 == lVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    local_40 = *(QAbstractAnimation **)((long)ppQVar1 + lVar5);
    iVar3 = (**(code **)(*(long *)local_40 + 0x60))();
    if (iVar3 == -1) {
LAB_003665ee:
      piVar4 = QHash<QAbstractAnimation_*,_int>::operator[]
                         (&this->uncontrolledFinishTime,(QAbstractAnimation **)&local_40);
      *piVar4 = -1;
      QAnimationGroupPrivate::connectUncontrolledAnimation
                (&this->super_QAnimationGroupPrivate,(QAbstractAnimation *)local_40);
    }
    else {
      iVar3 = QAbstractAnimation::loopCount(local_40);
      if (iVar3 < 0) goto LAB_003665ee;
    }
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

void QParallelAnimationGroupPrivate::connectUncontrolledAnimations()
{
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it) {
        QAbstractAnimation *animation = *it;
        if (animation->duration() == -1 || animation->loopCount() < 0) {
            uncontrolledFinishTime[animation] = -1;
            connectUncontrolledAnimation(animation);
        }
    }
}